

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.cxx
# Opt level: O2

bool operator<(cmLinkItem *l,cmLinkItem *r)

{
  cmGeneratorTarget *pcVar1;
  byte extraout_var;
  
  pcVar1 = r->Target;
  if (l->Target != (cmGeneratorTarget *)0x0) {
    return l->Target < pcVar1 || pcVar1 == (cmGeneratorTarget *)0x0;
  }
  if (pcVar1 != (cmGeneratorTarget *)0x0) {
    return false;
  }
  std::__cxx11::string::compare((string *)l);
  return (bool)(extraout_var >> 7);
}

Assistant:

bool operator<(cmLinkItem const& l, cmLinkItem const& r)
{
  // Order among targets.
  if (l.Target && r.Target) {
    return l.Target < r.Target;
  }
  // Order targets before strings.
  if (l.Target) {
    return true;
  }
  if (r.Target) {
    return false;
  }
  // Order among strings.
  return l.String < r.String;
}